

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# puff.cpp
# Opt level: O0

int codes(state *s,huffman *lencode,huffman *distcode)

{
  short sVar1;
  int iVar2;
  int local_30;
  uint dist;
  int len;
  int symbol;
  huffman *distcode_local;
  huffman *lencode_local;
  state *s_local;
  
  do {
    dist = decode(s,lencode);
    if ((int)dist < 0) {
      return dist;
    }
    if ((int)dist < 0x100) {
      if (s->out != (uchar *)0x0) {
        if (s->outcnt == s->outlen) {
          return 1;
        }
        s->out[s->outcnt] = (uchar)dist;
      }
      s->outcnt = s->outcnt + 1;
    }
    else if (0x100 < (int)dist) {
      iVar2 = dist - 0x101;
      if (0x1c < iVar2) {
        return -10;
      }
      sVar1 = codes::lens[iVar2];
      local_30 = bits(s,(int)codes::lext[iVar2]);
      local_30 = sVar1 + local_30;
      dist = decode(s,distcode);
      if ((int)dist < 0) {
        return dist;
      }
      sVar1 = codes::dists[(int)dist];
      iVar2 = bits(s,(int)codes::dext[(int)dist]);
      if (s->outcnt < (ulong)(uint)(sVar1 + iVar2)) {
        return -0xb;
      }
      if (s->out == (uchar *)0x0) {
        s->outcnt = (long)local_30 + s->outcnt;
      }
      else {
        if (s->outlen < s->outcnt + (long)local_30) {
          return 1;
        }
        while (local_30 != 0) {
          s->out[s->outcnt] = s->out[s->outcnt - (ulong)(uint)(sVar1 + iVar2)];
          s->outcnt = s->outcnt + 1;
          local_30 = local_30 + -1;
        }
      }
    }
    if (dist == 0x100) {
      return 0;
    }
  } while( true );
}

Assistant:

local int codes(struct state *s,
                const struct huffman *lencode,
                const struct huffman *distcode)
{
    int symbol;         /* decoded symbol */
    int len;            /* length for copy */
    unsigned dist;      /* distance for copy */
    static const short lens[29] = { /* Size base for length codes 257..285 */
        3, 4, 5, 6, 7, 8, 9, 10, 11, 13, 15, 17, 19, 23, 27, 31,
        35, 43, 51, 59, 67, 83, 99, 115, 131, 163, 195, 227, 258};
    static const short lext[29] = { /* Extra bits for length codes 257..285 */
        0, 0, 0, 0, 0, 0, 0, 0, 1, 1, 1, 1, 2, 2, 2, 2,
        3, 3, 3, 3, 4, 4, 4, 4, 5, 5, 5, 5, 0};
    static const short dists[30] = { /* Offset base for distance codes 0..29 */
        1, 2, 3, 4, 5, 7, 9, 13, 17, 25, 33, 49, 65, 97, 129, 193,
        257, 385, 513, 769, 1025, 1537, 2049, 3073, 4097, 6145,
        8193, 12289, 16385, 24577};
    static const short dext[30] = { /* Extra bits for distance codes 0..29 */
        0, 0, 0, 0, 1, 1, 2, 2, 3, 3, 4, 4, 5, 5, 6, 6,
        7, 7, 8, 8, 9, 9, 10, 10, 11, 11,
        12, 12, 13, 13};

    /* decode literals and length/distance pairs */
    do {
        symbol = decode(s, lencode);
        if (symbol < 0)
            return symbol;              /* invalid symbol */
        if (symbol < 256) {             /* literal: symbol is the byte */
            /* write out the literal */
            if (s->out != nullptr) {
                if (s->outcnt == s->outlen)
                    return 1;
                s->out[s->outcnt] = symbol;
            }
            s->outcnt++;
        }
        else if (symbol > 256) {        /* length */
            /* get and compute length */
            symbol -= 257;
            if (symbol >= 29)
                return -10;             /* invalid fixed code */
            len = lens[symbol] + bits(s, lext[symbol]);

            /* get and check distance */
            symbol = decode(s, distcode);
            if (symbol < 0)
                return symbol;          /* invalid symbol */
            dist = dists[symbol] + bits(s, dext[symbol]);
#ifndef INFLATE_ALLOW_INVALID_DISTANCE_TOOFAR_ARRR
            if (dist > s->outcnt)
                return -11;     /* distance too far back */
#endif

            /* copy length bytes from distance bytes back */
            if (s->out != nullptr) {
                if (s->outcnt + len > s->outlen)
                    return 1;
                while (len--) {
                    s->out[s->outcnt] =
#ifdef INFLATE_ALLOW_INVALID_DISTANCE_TOOFAR_ARRR
                        dist > s->outcnt ?
                            0 :
#endif
                            s->out[s->outcnt - dist];
                    s->outcnt++;
                }
            }
            else
                s->outcnt += len;
        }
    } while (symbol != 256);            /* end of block symbol */

    /* done with a valid fixed or dynamic block */
    return 0;
}